

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void __thiscall
cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning
          (cmTargetLinkLibrariesCommand *this,int left,int right)

{
  cmMakefile *this_00;
  ostream *poVar1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream w;
  int right_local;
  int left_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Link library type specifier \"");
  poVar1 = std::operator<<(poVar1,LinkLibraryTypeNames[left]);
  poVar1 = std::operator<<(poVar1,"\" is followed by specifier \"");
  poVar1 = std::operator<<(poVar1,LinkLibraryTypeNames[right]);
  poVar1 = std::operator<<(poVar1,"\" instead of a library name.  ");
  std::operator<<(poVar1,"The first specifier will be ignored.");
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::ostringstream::str();
  cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning(int left,
                                                                   int right)
{
  std::ostringstream w;
  w << "Link library type specifier \"" << this->LinkLibraryTypeNames[left]
    << "\" is followed by specifier \"" << this->LinkLibraryTypeNames[right]
    << "\" instead of a library name.  "
    << "The first specifier will be ignored.";
  this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
}